

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_OpenDoor(FParser *this)

{
  bool bVar1;
  int tag;
  int iVar2;
  int iVar3;
  int delay;
  EVlDoor type;
  double speed;
  
  type = doorOpen;
  bVar1 = CheckArgs(this,1);
  if (bVar1) {
    tag = intvalue(this->t_argv);
    if (tag != 0) {
      if (this->t_argc < 2) {
        speed = 2.0;
        delay = 0;
      }
      else {
        iVar2 = intvalue(this->t_argv + 1);
        delay = (iVar2 * 0x23) / 100;
        iVar3 = 1;
        if (2 < this->t_argc) {
          iVar3 = intvalue(this->t_argv + 2);
        }
        bVar1 = iVar2 * 0x23 + 99U < 199;
        if (bVar1) {
          delay = 0;
        }
        type = doorRaise - bVar1;
        iVar2 = 0x7f;
        if (iVar3 < 0x7f) {
          iVar2 = iVar3;
        }
        iVar3 = 1;
        if (1 < iVar2) {
          iVar3 = iVar2;
        }
        speed = (double)(iVar3 * 2);
      }
      EV_DoDoor(type,(line_t_conflict *)0x0,(AActor *)0x0,tag,speed,delay,0,0,false,0);
    }
  }
  return;
}

Assistant:

void FParser::SF_OpenDoor(void)
{
	int speed, wait_time;
	int sectag;
	
	if (CheckArgs(1))
	{
		// got sector tag
		sectag = intvalue(t_argv[0]);
		if (sectag==0) return;	// tag 0 not allowed
		
		// door wait time
		if(t_argc > 1) wait_time = (intvalue(t_argv[1]) * TICRATE) / 100;
		else wait_time = 0;  // 0= stay open
		
		// door speed
		if(t_argc > 2) speed = intvalue(t_argv[2]);
		else speed = 1;    // 1= normal speed

		EV_DoDoor(wait_time ? DDoor::doorRaise : DDoor::doorOpen, NULL, NULL, sectag, 2. * clamp(speed, 1, 127), wait_time, 0, 0);
	}
}